

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

ParseResult * toml::parseFile(ParseResult *__return_storage_ptr__,string *filename)

{
  allocator local_271;
  Value local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ifstream ifs;
  byte abStack_200 [488];
  
  std::ifstream::ifstream(&ifs,(string *)filename,_S_in);
  if ((abStack_200[(long)_ifs[-3]] & 5) == 0) {
    parse(__return_storage_ptr__,(istream *)&ifs);
  }
  else {
    local_270.type_ = NULL_TYPE;
    local_270.field_1.null_ = (void *)0x0;
    std::__cxx11::string::string((string *)&local_260,"could not open file: ",&local_271);
    std::operator+(&local_240,&local_260,filename);
    ParseResult::ParseResult(__return_storage_ptr__,&local_270,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    Value::~Value(&local_270);
  }
  std::ifstream::~ifstream(&ifs);
  return __return_storage_ptr__;
}

Assistant:

inline ParseResult parseFile(const std::string& filename)
{
    std::ifstream ifs(filename);
    if (!ifs) {
        return ParseResult(toml::Value(),
                           std::string("could not open file: ") + filename);
    }

    return parse(ifs);
}